

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O1

void cppwinrt::write_produce_method(writer *w,MethodDef *method)

{
  bool bVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view format;
  string upcall;
  method_signature signature;
  string_view local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  anon_class_8_1_89897ddb_conflict1 local_170;
  anon_class_8_1_89897ddb_conflict1 local_168;
  anon_class_16_2_3ed68039_conflict4 local_160;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  method_signature local_140;
  
  local_1a8._M_len = 0;
  local_1a8._M_str = (char *)0x0;
  bVar1 = is_noexcept(method);
  local_1a8._M_len = 0xcf;
  if (bVar1) {
    local_1a8._M_len = 0x9e;
  }
  local_1a8._M_str =
       "        int32_t __stdcall %(%) noexcept final try\n        {\n%            typename D::abi_guard guard(this->shim());\n            %\n            return 0;\n        }\n        catch (...) { return to_hresult(); }\n"
  ;
  if (bVar1) {
    local_1a8._M_str =
         "        int32_t __stdcall %(%) noexcept final\n        {\n%            typename D::abi_guard guard(this->shim());\n            %\n            return 0;\n        }\n"
    ;
  }
  method_signature::method_signature(&local_140,method);
  bVar2 = method_signature::is_async(&local_140);
  bVar1 = w->async_types;
  w->async_types = bVar2;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"this->shim().","");
  bVar3 = get_name(method);
  std::__cxx11::string::append((char *)&local_190,(ulong)bVar3._M_str);
  local_150 = get_abi_name(method);
  local_170.args = &local_140;
  local_168.args = &local_140;
  local_160.args = &local_190;
  local_160.args = &local_140;
  writer_base<cppwinrt::writer>::
  write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_1a8,&local_150,&local_168,&local_170,
             &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  w->async_types = bVar1;
  if (local_140.m_params.
      super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.m_params.
                    super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.m_params.
                          super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.m_params.
                          super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>::~vector
            (&local_140.m_signature.m_params);
  if (local_140.m_signature.m_ret_type.m_type.
      super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
      super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
      super__Optional_payload_base<winmd::reader::TypeSig>._M_engaged == true) {
    std::_Optional_payload_base<winmd::reader::TypeSig>::_M_destroy
              ((_Optional_payload_base<winmd::reader::TypeSig> *)
               &local_140.m_signature.m_ret_type.m_type);
  }
  if (local_140.m_signature.m_ret_type.m_cmod.
      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.m_signature.m_ret_type.m_cmod.
                    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.m_signature.m_ret_type.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.m_signature.m_ret_type.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void write_produce_method(writer& w, MethodDef const& method)
    {
        std::string_view format;

        if (is_noexcept(method))
        {
            format = R"(        int32_t __stdcall %(%) noexcept final
        {
%            typename D::abi_guard guard(this->shim());
            %
            return 0;
        }
)";
        }
        else
        {
            format = R"(        int32_t __stdcall %(%) noexcept final try
        {
%            typename D::abi_guard guard(this->shim());
            %
            return 0;
        }
        catch (...) { return to_hresult(); }
)";
        }

        method_signature signature{ method };
        auto async_types_guard = w.push_async_types(signature.is_async());
        std::string upcall = "this->shim().";
        upcall += get_name(method);

        w.write(format,
            get_abi_name(method),
            bind<write_produce_params>(signature),
            bind<write_produce_cleanup>(signature),
            bind<write_produce_upcall>(upcall, signature));
    }